

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

bool crnlib::unpack_etc1(etc1_block *block,color_quad_u8 *pDst,bool preserve_alpha)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  ushort packed_color5;
  bool bVar9;
  uint uVar10;
  uint table_idx;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aaStack_58 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_48 [4];
  uint local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,preserve_alpha);
  bVar7 = (block->field_0).m_bytes[3];
  uVar8 = (uint)bVar7;
  table_idx = bVar7 >> 2 & 7;
  bVar1 = (block->field_0).m_bytes[0];
  uVar10 = (uint)bVar1;
  if ((bVar7 & 2) == 0) {
    bVar2 = (block->field_0).m_bytes[1];
    local_38 = (uint)bVar7;
    bVar3 = (block->field_0).m_bytes[2];
    etc1_block::get_abs_subblock_colors
              ((color_quad_u8 *)&local_48[0].field_0,
               (ushort)((uVar10 & 0xf0) << 4) | (ushort)(byte)(bVar3 >> 4 | bVar2 & 0xf0),
               (uint)(bVar7 >> 5));
    uVar8 = local_38;
    etc1_block::get_abs_subblock_colors
              ((color_quad_u8 *)&aaStack_58[0].field_0,
               CONCAT11(bVar1,bVar2 << 4 | bVar3 & 0xf) & 0xfff,table_idx);
    bVar5 = true;
  }
  else {
    bVar1 = (block->field_0).m_bytes[1];
    bVar2 = (block->field_0).m_bytes[2];
    packed_color5 = (ushort)((uVar10 & 0xf8) << 7) | (ushort)(bVar2 >> 3) + (bVar1 & 0xfff8) * 4;
    etc1_block::get_diff_subblock_colors
              ((color_quad_u8 *)&local_48[0].field_0,packed_color5,(uint)(bVar7 >> 5));
    bVar5 = etc1_block::get_diff_subblock_colors
                      ((color_quad_u8 *)&aaStack_58[0].field_0,packed_color5,
                       (ushort)((uVar10 & 7) << 6) | (bVar2 & 7) + (bVar1 & 7) * 8,table_idx);
  }
  if ((char)local_34 == '\0') {
    if ((uVar8 & 1) == 0) {
      uVar8 = 0;
      do {
        *pDst = (color_quad_u8)
                local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                  (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar8 & 0x1f) & 1)
                                                != 0) +
                                         ((block->field_0).m_bytes[5] >> ((byte)uVar8 & 0x1f) & 1) *
                                         2))];
        uVar10 = uVar8 + 4;
        (&pDst->field_0)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar10 & 0x1f) & 1)
                                             != 0) +
                                      ((block->field_0).m_bytes[5] >> ((byte)uVar10 & 0x1f) & 1) * 2
                                      ))];
        (&pDst->field_0)[2] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar8 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar8 & 0x1f) & 1) * 2))];
        (&pDst->field_0)[3] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar10 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar10 & 0x1f) & 1) * 2))];
        pDst = (color_quad_u8 *)(&pDst->field_0 + 4);
        uVar8 = uVar8 + 1;
      } while (uVar8 != 4);
    }
    else {
      bVar7 = 0;
      bVar4 = true;
      do {
        bVar9 = bVar4;
        *pDst = (color_quad_u8)
                local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                  (ulong)((uint)(((block->field_0).m_bytes[7] >> bVar7 & 1) != 0) +
                                         ((block->field_0).m_bytes[5] >> bVar7 & 1) * 2))];
        (&pDst->field_0)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[7] >> (bVar7 | 4) & 1) != 0)
                                      + ((block->field_0).m_bytes[5] >> (bVar7 | 4) & 1) * 2))];
        (&pDst->field_0)[2] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[6] >> bVar7 & 1) != 0) +
                                      ((block->field_0).m_bytes[4] >> bVar7 & 1) * 2))];
        (&pDst->field_0)[3] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[6] >> (bVar7 | 4) & 1) != 0)
                                      + ((block->field_0).m_bytes[4] >> (bVar7 | 4) & 1) * 2))];
        pDst = (color_quad_u8 *)(&pDst->field_0 + 4);
        bVar7 = 1;
        bVar4 = false;
      } while (bVar9);
      uVar8 = 2;
      do {
        uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                                (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar8 & 0x1f) & 1)
                                              != 0) +
                                       ((block->field_0).m_bytes[5] >> ((byte)uVar8 & 0x1f) & 1) * 2
                                       ));
        ((anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          *)pDst)->r = aaStack_58[0].c[uVar6 * 4];
        ((anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          *)pDst)->g = aaStack_58[0].c[uVar6 * 4 + 1];
        ((anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          *)pDst)->b = aaStack_58[0].c[uVar6 * 4 + 2];
        ((anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
          *)pDst)->a = aaStack_58[0].c[uVar6 * 4 + 3];
        uVar10 = uVar8 + 4;
        uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                                (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar10 & 0x1f) & 1)
                                              != 0) +
                                       ((block->field_0).m_bytes[5] >> ((byte)uVar10 & 0x1f) & 1) *
                                       2));
        (&pDst->field_0)[1].field_0.r = aaStack_58[0].c[uVar6 * 4];
        *(uchar *)((long)pDst + 5) = aaStack_58[0].c[uVar6 * 4 + 1];
        *(uchar *)((long)pDst + 6) = aaStack_58[0].c[uVar6 * 4 + 2];
        *(uchar *)((long)pDst + 7) = aaStack_58[0].c[uVar6 * 4 + 3];
        uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                                (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar8 & 0x1f) & 1)
                                              != 0) +
                                       ((block->field_0).m_bytes[4] >> ((byte)uVar8 & 0x1f) & 1) * 2
                                       ));
        (&pDst->field_0)[2].field_0.r = aaStack_58[0].c[uVar6 * 4];
        *(uchar *)((long)pDst + 9) = aaStack_58[0].c[uVar6 * 4 + 1];
        *(uchar *)((long)pDst + 10) = aaStack_58[0].c[uVar6 * 4 + 2];
        *(uchar *)((long)pDst + 0xb) = aaStack_58[0].c[uVar6 * 4 + 3];
        uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                                (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar10 & 0x1f) & 1)
                                              != 0) +
                                       ((block->field_0).m_bytes[4] >> ((byte)uVar10 & 0x1f) & 1) *
                                       2));
        (&pDst->field_0)[3].field_0.r = aaStack_58[0].c[uVar6 * 4];
        *(uchar *)((long)pDst + 0xd) = aaStack_58[0].c[uVar6 * 4 + 1];
        *(uchar *)((long)pDst + 0xe) = aaStack_58[0].c[uVar6 * 4 + 2];
        *(uchar *)((long)pDst + 0xf) = aaStack_58[0].c[uVar6 * 4 + 3];
        pDst = (color_quad_u8 *)(&pDst->field_0 + 4);
        uVar8 = uVar8 + 1;
      } while (uVar8 != 4);
    }
  }
  else if ((uVar8 & 1) == 0) {
    uVar8 = 0;
    do {
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar8 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar8 & 0x1f) & 1) * 2))
      ;
      (pDst->field_0).field_0.r = local_48[0].c[uVar6 * 4];
      (pDst->field_0).field_0.g = local_48[0].c[uVar6 * 4 + 1];
      (pDst->field_0).field_0.b = local_48[0].c[uVar6 * 4 + 2];
      uVar10 = uVar8 + 4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar10 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar10 & 0x1f) & 1) * 2)
                              );
      pDst[1].field_0.field_0.r = local_48[0].c[uVar6 * 4];
      pDst[1].field_0.field_0.g = local_48[0].c[uVar6 * 4 + 1];
      pDst[1].field_0.field_0.b = local_48[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar8 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar8 & 0x1f) & 1) * 2))
      ;
      pDst[2].field_0.field_0.r = aaStack_58[0].c[uVar6 * 4];
      pDst[2].field_0.field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      pDst[2].field_0.field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar10 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar10 & 0x1f) & 1) * 2)
                              );
      pDst[3].field_0.field_0.r = aaStack_58[0].c[uVar6 * 4];
      pDst[3].field_0.field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      pDst[3].field_0.field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      pDst = pDst + 4;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
  }
  else {
    bVar7 = 0;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> bVar7 & 1) != 0) +
                                     ((block->field_0).m_bytes[5] >> bVar7 & 1) * 2));
      (pDst->field_0).field_0.r = local_48[0].c[uVar6 * 4];
      (pDst->field_0).field_0.g = local_48[0].c[uVar6 * 4 + 1];
      (pDst->field_0).field_0.b = local_48[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (bVar7 | 4) & 1) != 0)
                                     + ((block->field_0).m_bytes[5] >> (bVar7 | 4) & 1) * 2));
      pDst[1].field_0.field_0.r = local_48[0].c[uVar6 * 4];
      pDst[1].field_0.field_0.g = local_48[0].c[uVar6 * 4 + 1];
      pDst[1].field_0.field_0.b = local_48[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> bVar7 & 1) != 0) +
                                     ((block->field_0).m_bytes[4] >> bVar7 & 1) * 2));
      pDst[2].field_0.field_0.r = local_48[0].c[uVar6 * 4];
      pDst[2].field_0.field_0.g = local_48[0].c[uVar6 * 4 + 1];
      pDst[2].field_0.field_0.b = local_48[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (bVar7 | 4) & 1) != 0)
                                     + ((block->field_0).m_bytes[4] >> (bVar7 | 4) & 1) * 2));
      pDst[3].field_0.field_0.r = local_48[0].c[uVar6 * 4];
      pDst[3].field_0.field_0.g = local_48[0].c[uVar6 * 4 + 1];
      pDst[3].field_0.field_0.b = local_48[0].c[uVar6 * 4 + 2];
      pDst = pDst + 4;
      bVar7 = 1;
      bVar4 = false;
    } while (bVar9);
    uVar8 = 2;
    do {
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar8 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar8 & 0x1f) & 1) * 2))
      ;
      (pDst->field_0).field_0.r = aaStack_58[0].c[uVar6 * 4];
      (pDst->field_0).field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      (pDst->field_0).field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      uVar10 = uVar8 + 4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar10 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar10 & 0x1f) & 1) * 2)
                              );
      pDst[1].field_0.field_0.r = aaStack_58[0].c[uVar6 * 4];
      pDst[1].field_0.field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      pDst[1].field_0.field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar8 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar8 & 0x1f) & 1) * 2))
      ;
      pDst[2].field_0.field_0.r = aaStack_58[0].c[uVar6 * 4];
      pDst[2].field_0.field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      pDst[2].field_0.field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar10 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar10 & 0x1f) & 1) * 2)
                              );
      pDst[3].field_0.field_0.r = aaStack_58[0].c[uVar6 * 4];
      pDst[3].field_0.field_0.g = aaStack_58[0].c[uVar6 * 4 + 1];
      pDst[3].field_0.field_0.b = aaStack_58[0].c[uVar6 * 4 + 2];
      pDst = pDst + 4;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
  }
  return bVar5;
}

Assistant:

bool unpack_etc1(const etc1_block& block, color_quad_u8* pDst, bool preserve_alpha)
    {
        const bool diff_flag = block.get_diff_bit();
        const bool flip_flag = block.get_flip_bit();
        const uint table_index0 = block.get_inten_table(0);
        const uint table_index1 = block.get_inten_table(1);

        color_quad_u8 subblock_colors0[4];
        color_quad_u8 subblock_colors1[4];
        bool success = true;

        if (diff_flag)
        {
            const uint16 base_color5 = block.get_base5_color();
            const uint16 delta_color3 = block.get_delta3_color();
            etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

            if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
            {
                success = false;
            }
        }
        else
        {
            const uint16 base_color4_0 = block.get_base4_color(0);
            etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

            const uint16 base_color4_1 = block.get_base4_color(1);
            etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
        }

        if (preserve_alpha)
        {
            if (flip_flag)
            {
                for (uint y = 0; y < 2; y++)
                {
                    pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
                    pDst += 4;
                }

                for (uint y = 2; y < 4; y++)
                {
                    pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                    pDst += 4;
                }
            }
            else
            {
                for (uint y = 0; y < 4; y++)
                {
                    pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                    pDst += 4;
                }
            }
        }
        else
        {
            if (flip_flag)
            {
                // 0000
                // 0000
                // 1111
                // 1111
                for (uint y = 0; y < 2; y++)
                {
                    pDst[0] = subblock_colors0[block.get_selector(0, y)];
                    pDst[1] = subblock_colors0[block.get_selector(1, y)];
                    pDst[2] = subblock_colors0[block.get_selector(2, y)];
                    pDst[3] = subblock_colors0[block.get_selector(3, y)];
                    pDst += 4;
                }

                for (uint y = 2; y < 4; y++)
                {
                    pDst[0] = subblock_colors1[block.get_selector(0, y)];
                    pDst[1] = subblock_colors1[block.get_selector(1, y)];
                    pDst[2] = subblock_colors1[block.get_selector(2, y)];
                    pDst[3] = subblock_colors1[block.get_selector(3, y)];
                    pDst += 4;
                }
            }
            else
            {
                // 0011
                // 0011
                // 0011
                // 0011
                for (uint y = 0; y < 4; y++)
                {
                    pDst[0] = subblock_colors0[block.get_selector(0, y)];
                    pDst[1] = subblock_colors0[block.get_selector(1, y)];
                    pDst[2] = subblock_colors1[block.get_selector(2, y)];
                    pDst[3] = subblock_colors1[block.get_selector(3, y)];
                    pDst += 4;
                }
            }
        }

        return success;
    }